

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  void **ppvVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Rep *pRVar5;
  bool bVar6;
  Type *from;
  Type *pTVar7;
  Type *pTVar8;
  iterator iVar9;
  string *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  void **ppvVar10;
  int index;
  size_type sVar11;
  undefined1 *puVar12;
  int index_00;
  string error;
  set<int,_std::less<int>,_std::allocator<int>_> used_values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  RepeatedPtrFieldBase *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  _Base_ptr local_70;
  Rep *local_68;
  ArenaStringPtr local_60;
  
  index = 0;
  do {
    puVar12 = (undefined1 *)proto->options_;
    if ((EnumOptions *)puVar12 == (EnumOptions *)0x0) {
      puVar12 = _EnumOptions_default_instance_;
    }
    iVar3 = (((EnumOptions *)puVar12)->uninterpreted_option_).super_RepeatedPtrFieldBase.
            current_size_;
    if (iVar3 <= index) goto LAB_0034e500;
    from = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                     (&(((EnumOptions *)puVar12)->uninterpreted_option_).super_RepeatedPtrFieldBase,
                      index);
    UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_90,from);
    if (((int)local_70 < 2) &&
       (pTVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                           ((RepeatedPtrFieldBase *)(local_80 + 8),0),
       pTVar7->is_extension_ == false)) {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(local_80 + 8),0);
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(pTVar7->name_part_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                              "allow_alias");
      if (bVar6) break;
    }
    UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
    index = index + 1;
  } while( true );
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)local_60.tagged_ptr_.ptr_ & 0xfffffffffffffffe),"true");
  UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
  if (bVar6) {
LAB_0034e500:
    local_80._8_8_ = local_90 + 8;
    local_90._8_4_ = _S_red;
    local_80._0_8_ = (_Base_ptr)0x0;
    local_68 = (Rep *)0x0;
    local_b8 = &(proto->value_).super_RepeatedPtrFieldBase;
    local_70 = (_Base_ptr)local_80._8_8_;
    for (index_00 = 0; iVar4 = (proto->value_).super_RepeatedPtrFieldBase.current_size_,
        index_00 < iVar4; index_00 = index_00 + 1) {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                         (local_b8,index_00);
      local_d8._M_dataplus._M_p._0_4_ = pTVar8->number_;
      iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_90,(key_type *)&local_d8);
      if (iVar9._M_node != (_Base_ptr)(local_90 + 8)) {
        if (iVar3 <= index) goto LAB_0034e5e9;
        bVar6 = true;
        if (index_00 < iVar4) goto LAB_0034e695;
        goto LAB_0034e590;
      }
      local_d8._M_dataplus._M_p._0_4_ = pTVar8->number_;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_90,(int *)&local_d8);
    }
    if (index < iVar3) {
LAB_0034e590:
      std::operator+(&local_b0,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&local_d8,&local_b0,
                     "\" declares support for enum aliases but no enum values share field numbers. Please remove the unnecessary \'option allow_alias = true;\' declaration."
                    );
      std::__cxx11::string::~string((string *)&local_b0);
      AddError(this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      bVar6 = false;
    }
    else {
LAB_0034e5e9:
      pRVar5 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
      ppvVar10 = pRVar5->elements;
      if (pRVar5 == (Rep *)0x0) {
        ppvVar10 = (void **)0x0;
      }
      ppvVar1 = ppvVar10 + (proto->value_).super_RepeatedPtrFieldBase.current_size_;
      for (; ppvVar10 != ppvVar1; ppvVar10 = ppvVar10 + 1) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(ulong *)((long)*ppvVar10 + 0x18) & 0xfffffffffffffffe);
        sVar11 = 0;
        do {
          if (__rhs->_M_string_length == sVar11) goto LAB_0034e68d;
          cVar2 = (__rhs->_M_dataplus)._M_p[sVar11];
          sVar11 = sVar11 + 1;
        } while ((((byte)(cVar2 - 0x30U) < 10) || (cVar2 == '_')) || ((byte)(cVar2 + 0xbfU) < 0x1a))
        ;
        std::operator+(&local_b0,"Enum constant should be in UPPER_CASE. Found: ",__rhs);
        std::operator+(&local_d8,&local_b0,
                       ". See https://developers.google.com/protocol-buffers/docs/style");
        AddWarning(this,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
LAB_0034e68d:
      }
      bVar6 = true;
    }
LAB_0034e695:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_90);
  }
  else {
    std::operator+(&local_d8,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &local_d8,
                   "\" declares \'option allow_alias = false;\' which has no effect. Please remove the declaration."
                  );
    std::__cxx11::string::~string((string *)&local_d8);
    AddError(this,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    std::string error =
        "\"" + proto->name() +
        "\" declares 'option allow_alias = false;' which has no effect. "
        "Please remove the declaration.";
    // This needlessly clutters declarations with nops.
    AddError(error);
    return false;
  }

  std::set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    std::string error =
        "\"" + proto->name() +
        "\" declares support for enum aliases but no enum values share field "
        "numbers. Please remove the unnecessary 'option allow_alias = true;' "
        "declaration.";
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    AddError(error);
    return false;
  }

  // Enforce that enum constants must be UPPER_CASE except in case of
  // enum_alias.
  if (!allow_alias) {
    for (const auto& enum_value : proto->value()) {
      if (!IsUpperUnderscore(enum_value.name())) {
        AddWarning(
            "Enum constant should be in UPPER_CASE. Found: " +
            enum_value.name() +
            ". See https://developers.google.com/protocol-buffers/docs/style");
      }
    }
  }

  return true;
}